

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApertureILS.cpp
# Opt level: O3

pair<bool,_std::pair<imrt::Station_*,_int>_> * __thiscall
imrt::ApertureILS::getLSBeamlet
          (pair<bool,_std::pair<imrt::Station_*,_int>_> *__return_storage_ptr__,ApertureILS *this,
          Plan *P)

{
  bool bVar1;
  int iVar2;
  _Base_ptr p_Var3;
  ostream *this_00;
  long *plVar4;
  byte bVar5;
  long lVar6;
  ulong uVar7;
  Station *this_01;
  set<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>,_std::greater<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>,_std::allocator<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>_>
  sb;
  _Rb_tree<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>,_std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>,_std::_Identity<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>,_std::greater<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>,_std::allocator<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>_>
  local_60;
  
  Plan::best_beamlets((set<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>,_std::greater<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>,_std::allocator<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>_>
                       *)&local_60,P,(this->super_ILS).bsize,(this->super_ILS).vsize,0);
  p_Var3 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (local_60._M_impl.super__Rb_tree_header._M_node_count == 0) {
    __return_storage_ptr__->first = false;
  }
  else {
    iVar2 = rand();
    iVar2 = (int)((ulong)(long)iVar2 % local_60._M_impl.super__Rb_tree_header._M_node_count);
    lVar6 = (long)iVar2;
    if (iVar2 < 1) {
      if (iVar2 != 0) {
        do {
          p_Var3 = (_Base_ptr)std::_Rb_tree_decrement(p_Var3);
          lVar6 = lVar6 + 1;
        } while (lVar6 != 0);
      }
    }
    else {
      do {
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
        lVar6 = lVar6 + -1;
      } while (lVar6 != 0);
    }
    this_01 = (Station *)p_Var3[1]._M_left;
    iVar2 = *(int *)&p_Var3[1]._M_right;
    bVar5 = *(byte *)&p_Var3[1]._M_parent;
    bVar1 = Station::isActiveBeamlet(this_01,iVar2);
    if (bVar1) {
      uVar7 = 1;
      while (bVar1 = isBeamletModifiable(this,iVar2,this_01,(bool)(~bVar5 & 1)), !bVar1) {
        if (uVar7 == local_60._M_impl.super__Rb_tree_header._M_node_count) goto LAB_0012896a;
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
        if ((_Rb_tree_header *)p_Var3 == &local_60._M_impl.super__Rb_tree_header) {
          p_Var3 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
        }
        this_01 = (Station *)p_Var3[1]._M_left;
        iVar2 = *(int *)&p_Var3[1]._M_right;
        bVar5 = *(byte *)&p_Var3[1]._M_parent;
        uVar7 = uVar7 + 1;
      }
      __return_storage_ptr__->first = (bool)bVar5;
      (__return_storage_ptr__->second).first = this_01;
      goto LAB_00128978;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ERROR!: Beamlet ",0x10);
    this_00 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
    std::__ostream_insert<char,std::char_traits<char>>(this_00," not active in station",0x16);
    plVar4 = (long *)std::ostream::operator<<((ostream *)this_00,this_01->angle);
    std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
    std::ostream::put((char)plVar4);
    std::ostream::flush();
LAB_0012896a:
    __return_storage_ptr__->first = false;
    (__return_storage_ptr__->second).first = this_01;
  }
  iVar2 = -1;
LAB_00128978:
  (__return_storage_ptr__->second).second = iVar2;
  std::
  _Rb_tree<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>,_std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>,_std::_Identity<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>,_std::greater<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>,_std::allocator<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>_>
  ::~_Rb_tree(&local_60);
  return __return_storage_ptr__;
}

Assistant:

pair <bool, pair<Station*, int> > ApertureILS::getLSBeamlet(Plan& P){
  auto sb = P.best_beamlets(bsize, vsize);
  Station* s;
  if (sb.size() < 1) return(make_pair(false, make_pair(s,-1))); 

  auto it = sb.begin();
  int addit = rand()%sb.size();
  std::advance(it,addit);

  s = it->second.first; 
  int beamlet = it->second.second;
  bool sign = it->first.second; 
  
  if (!s->isActiveBeamlet(beamlet)){ 
    cout<< "ERROR!: Beamlet "<< beamlet << " not active in station" << s->getAngle()  << endl;
    return(make_pair(false, make_pair(s,-1)));
  }

  int i=0;
  while (!isBeamletModifiable(beamlet, s, !sign)) {
    // If no beamlet was found return -1
    i++;
    if (i==sb.size()) {
      return(make_pair(false, make_pair(s,-1)));
    }
    std::advance(it,1);
    if (it==sb.end()) it = sb.begin();

    s = it->second.first; 
    beamlet = it->second.second;
    sign = it->first.second; 
  }
  return(make_pair(sign, make_pair(s,beamlet)));
}